

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

size_t __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBArrayValues
          (ConvertToolPrivate *this,char *tagData,size_t tagDataLength)

{
  char cVar1;
  uint uVar2;
  __type _Var3;
  BadDataException *pBVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (tagDataLength < 5) {
    pBVar4 = (BadDataException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_70,"Incomplete array tag data",(allocator *)&local_50);
    BadDataException::BadDataException(pBVar4,&local_70);
    __cxa_throw(pBVar4,&BadDataException::typeinfo,BadDataException::~BadDataException);
  }
  _Var3 = std::operator==(&this->m_settings->Format,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FORMAT_SAM_abi_cxx11_);
  if (_Var3) {
    cVar1 = *tagData;
    if (cVar1 == 's') {
      pcVar8 = "s,";
    }
    else if (cVar1 == 'I') {
      pcVar8 = "I,";
    }
    else if (cVar1 == 'S') {
      pcVar8 = "S,";
    }
    else if (cVar1 == 'c') {
      pcVar8 = "c,";
    }
    else if (cVar1 == 'f') {
      pcVar8 = "f,";
    }
    else if (cVar1 == 'i') {
      pcVar8 = "i,";
    }
    else {
      if (cVar1 != 'C') {
        pBVar4 = (BadDataException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_50,"Unknown B array type: ",&local_71);
        std::operator+(&local_70,&local_50,*tagData);
        BadDataException::BadDataException(pBVar4,&local_70);
        __cxa_throw(pBVar4,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      pcVar8 = "C,";
    }
    std::operator<<(&this->m_out,pcVar8);
  }
  uVar2 = *(uint *)(tagData + 1);
  cVar1 = *tagData;
  if (cVar1 == 'C') {
    uVar7 = 0;
    while( true ) {
      uVar5 = uVar7 + 5;
      if ((uVar2 <= (uint)uVar7) || (tagDataLength <= uVar5)) break;
      if ((uint)uVar7 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,(uint)(byte)tagData[uVar7 + 5]);
      uVar7 = uVar7 + 1;
    }
  }
  else if (cVar1 == 'I') {
    uVar7 = 0;
    uVar5 = 5;
    while ((uVar6 = (uint)uVar7, uVar6 < uVar2 && (uVar5 + 4 <= tagDataLength))) {
      if (uVar6 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::_M_insert<unsigned_long>((ulong)&this->m_out);
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = uVar5 + 4;
    }
  }
  else if (cVar1 == 'S') {
    uVar7 = 0;
    uVar5 = 5;
    while ((uVar6 = (uint)uVar7, uVar6 < uVar2 && (uVar5 + 2 <= tagDataLength))) {
      if (uVar6 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,*(ushort *)(tagData + uVar5));
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = uVar5 + 2;
    }
  }
  else if (cVar1 == 'c') {
    uVar7 = 0;
    while( true ) {
      uVar5 = uVar7 + 5;
      if ((uVar2 <= (uint)uVar7) || (tagDataLength <= uVar5)) break;
      if ((uint)uVar7 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,(int)tagData[uVar7 + 5]);
      uVar7 = uVar7 + 1;
    }
  }
  else if (cVar1 == 's') {
    uVar7 = 0;
    uVar5 = 5;
    while ((uVar6 = (uint)uVar7, uVar6 < uVar2 && (uVar5 + 2 <= tagDataLength))) {
      if (uVar6 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,*(short *)(tagData + uVar5));
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = uVar5 + 2;
    }
  }
  else if (cVar1 == 'i') {
    uVar7 = 0;
    uVar5 = 5;
    while ((uVar6 = (uint)uVar7, uVar6 < uVar2 && (uVar5 + 4 <= tagDataLength))) {
      if (uVar6 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,*(int *)(tagData + uVar5));
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = uVar5 + 4;
    }
  }
  else if (cVar1 == 'f') {
    uVar7 = 0;
    uVar5 = 5;
    while ((uVar6 = (uint)uVar7, uVar6 < uVar2 && (uVar5 + 4 <= tagDataLength))) {
      if (uVar6 != 0) {
        std::operator<<(&this->m_out,',');
      }
      std::ostream::operator<<(&this->m_out,*(float *)(tagData + uVar5));
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = uVar5 + 4;
    }
  }
  else {
    uVar7 = 0;
    uVar5 = 5;
  }
  if (uVar2 <= (uint)uVar7) {
    return uVar5;
  }
  pBVar4 = (BadDataException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_70,"Incomplete array tag data",(allocator *)&local_50);
  BadDataException::BadDataException(pBVar4,&local_70);
  __cxa_throw(pBVar4,&BadDataException::typeinfo,BadDataException::~BadDataException);
}

Assistant:

std::size_t ConvertTool::ConvertToolPrivate::PrintBArrayValues(const char* tagData,
                                                               std::size_t tagDataLength)
{
    // Need at least 5 bytes for type and array length
    if (tagDataLength < 5) {
        throw BadDataException("Incomplete array tag data");
    }

    if (m_settings->Format == FORMAT_SAM) {
        // Print array type letter
        switch (tagData[0]) {
            case (Constants::BAM_TAG_TYPE_INT8):
                m_out << "c,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT8):
                m_out << "C,";
                break;
            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "s,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "S,";
                break;
            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "I,";
                break;
            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f,";
                break;
            default:
                throw BadDataException(std::string("Unknown B array type: ") + tagData[0]);
        }
    }

    uint32_t arrayLength = BamTools::UnpackUnsignedInt(&tagData[1]);
    std::size_t index = 1 + sizeof(uint32_t);
    uint32_t i = 0;

    // Print array values.
    switch (tagData[0]) {
        case (Constants::BAM_TAG_TYPE_INT8):
            for (i = 0; i < arrayLength && index + sizeof(int8_t) <= tagDataLength;
                 i++, index += sizeof(int8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<int8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT8):
            for (i = 0; i < arrayLength && index + sizeof(uint8_t) <= tagDataLength;
                 i++, index += sizeof(uint8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<uint8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
            for (i = 0; i < arrayLength && index + sizeof(int16_t) <= tagDataLength;
                 i++, index += sizeof(int16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT16):
            for (i = 0; i < arrayLength && index + sizeof(uint16_t) <= tagDataLength;
                 i++, index += sizeof(uint16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT32):
            for (i = 0; i < arrayLength && index + sizeof(int32_t) <= tagDataLength;
                 i++, index += sizeof(int32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT32):
            for (i = 0; i < arrayLength && index + sizeof(uint32_t) <= tagDataLength;
                 i++, index += sizeof(uint32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
            for (i = 0; i < arrayLength && index + sizeof(float) <= tagDataLength;
                 i++, index += sizeof(float)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackFloat(&tagData[index]);
            }
            break;
    }
    if (i < arrayLength) {
        throw BadDataException("Incomplete array tag data");
    }

    return index;
}